

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_raffects(CHAR_DATA *ch,char *argument)

{
  EXIT_DATA *pEVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ROOM_INDEX_DATA *pRVar5;
  flag_type *pfVar6;
  char *pcVar7;
  char *pcVar8;
  ROOM_AFFECT_DATA *pRVar9;
  RUNE_DATA *pRVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  char buf [4608];
  
  pRVar5 = ch->in_room;
  bVar13 = pRVar5->affected != (ROOM_AFFECT_DATA *)0x0;
  if (bVar13) {
    send_to_char("The room is affected by:\n\r",ch);
    pRVar5 = ch->in_room;
    pRVar9 = pRVar5->affected;
    if (pRVar9 != (ROOM_AFFECT_DATA *)0x0) {
      do {
        uVar3 = pRVar9->aftype;
        if (uVar3 == 0) {
          sprintf(buf,"Spell: \'%s\' ",skill_table[pRVar9->type].name);
          uVar3 = pRVar9->aftype;
        }
        if (uVar3 == 1) {
          sprintf(buf,"Skill: \'%s\' ",skill_table[pRVar9->type].name);
          uVar3 = pRVar9->aftype;
        }
        if (uVar3 == 2) {
          sprintf(buf,"Power: \'%s\' ",skill_table[pRVar9->type].name);
          uVar3 = pRVar9->aftype;
        }
        if (uVar3 == 4) {
          sprintf(buf,"Commune: \'%s\' ",skill_table[pRVar9->type].name);
          uVar3 = pRVar9->aftype;
        }
        if (4 < uVar3) {
          sprintf(buf,"Spell: \'%s\' ",skill_table[pRVar9->type].name);
        }
        send_to_char(buf,ch);
        pcVar4 = raffect_loc_name(0);
        pcVar7 = "aff";
        if (pRVar9->where == 1) {
          pcVar7 = "const";
        }
        if (pRVar9->where == 2) {
          pcVar7 = "flag";
        }
        pcVar8 = "none";
        if (pRVar9->owner != (CHAR_DATA *)0x0) {
          pcVar8 = pRVar9->owner->name;
        }
        sprintf(buf,"modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",pcVar4
                ,(ulong)(uint)(int)pRVar9->modifier,
                (ulong)(uint)((int)(short)(pRVar9->duration - (pRVar9->duration >> 0xf)) >> 1),
                pcVar7,"nullptr",pcVar8,(ulong)(uint)(int)pRVar9->level);
        send_to_char(buf,ch);
        pRVar9 = pRVar9->next;
      } while (pRVar9 != (ROOM_AFFECT_DATA *)0x0);
      pRVar5 = ch->in_room;
    }
  }
  if ((pRVar5->has_rune == true) && (pRVar10 = pRVar5->rune, pRVar10 != (RUNE_DATA *)0x0)) {
    do {
      pcVar4 = skill_table[pRVar10->type].name;
      bVar2 = is_npc(pRVar10->owner);
      sprintf(buf,"Rune \'%s\' placed in room by %s, level %d, duration %d hours.\n\r",pcVar4,
              (&pRVar10->owner->name)[!bVar2],(ulong)(uint)pRVar10->level,
              (ulong)(uint)pRVar10->duration);
      send_to_char(buf,ch);
      pRVar10 = pRVar10->next_content;
    } while (pRVar10 != (RUNE_DATA *)0x0);
  }
  lVar11 = 0;
  do {
    pfVar6 = direction_table + lVar11;
    lVar12 = lVar11;
    while ((pEVar1 = ch->in_room->exit[lVar12], pEVar1 == (EXIT_DATA *)0x0 ||
           (pEVar1->has_rune != true))) {
      lVar12 = lVar12 + 1;
      pfVar6 = pfVar6 + 1;
      if (lVar12 == 6) {
        if (bVar13) {
          return;
        }
        send_to_char("The room is not affected by anything.\n\r",ch);
        return;
      }
    }
    pRVar10 = pEVar1->rune;
    pcVar4 = skill_table[pRVar10->type].name;
    pcVar7 = pfVar6->name;
    bVar13 = is_npc(pRVar10->owner);
    sprintf(buf,"Rune \'%s\' placed on %s door by %s, level %d, duration %d hours.\n\r",pcVar4,
            pcVar7,(&pRVar10->owner->name)[!bVar13],(ulong)(uint)pRVar10->level,
            (ulong)(uint)pRVar10->duration);
    send_to_char(buf,ch);
    lVar11 = lVar12 + 1;
    bVar13 = true;
  } while (lVar12 != 5);
  return;
}

Assistant:

void do_raffects(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA *paf;
	RUNE_DATA *rune;
	char buf[MAX_STRING_LENGTH];
	bool found = false;
	int i = 0;

	if (ch->in_room->affected != nullptr)
	{
		found = true;
		send_to_char("The room is affected by:\n\r", ch);

		for (paf = ch->in_room->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->aftype == AFT_SPELL)
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: '%s' ", skill_table[paf->type].name);

			if (paf->aftype != AFT_SPELL && paf->aftype != AFT_SKILL && paf->aftype != AFT_POWER &&
				paf->aftype != AFT_MALADY && paf->aftype != AFT_COMMUNE)
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);
			send_to_char(buf, ch);

			sprintf(buf, "modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",
				raffect_loc_name(paf->location),
				paf->modifier,
				paf->duration / 2,
				paf->where == TO_ROOM_FLAGS ? "flag" : paf->where == TO_ROOM_CONST ? "const" : "aff",
				"nullptr",
				paf->owner != nullptr ? paf->owner->name : "none",
				paf->level);
			send_to_char(buf, ch);
		}
	}

	if (ch->in_room->has_rune)
	{
		for (rune = ch->in_room->rune; rune; rune = rune->next_content)
		{
			sprintf(buf, "Rune '%s' placed in room by %s, level %d, duration %d hours.\n\r",
				skill_table[rune->type].name,
				!is_npc(rune->owner) ? rune->owner->true_name : rune->owner->name,
				rune->level,
				rune->duration);
			send_to_char(buf, ch);
		}
	}

	for (i = 0; i < 6; i++)
	{
		if (ch->in_room->exit[i] && ch->in_room->exit[i]->has_rune == true)
		{
			rune = ch->in_room->exit[i]->rune;

			sprintf(buf, "Rune '%s' placed on %s door by %s, level %d, duration %d hours.\n\r",
				skill_table[rune->type].name,
				direction_table[i].name,
				!is_npc(rune->owner) ? rune->owner->true_name : rune->owner->name,
				rune->level, rune->duration);
			send_to_char(buf, ch);

			found = true;
		}
	}

	if (!found)
		send_to_char("The room is not affected by anything.\n\r", ch);
}